

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

int amqp_open_socket_inner(char *hostname,int portnumber,amqp_time_t deadline)

{
  bool bVar1;
  int iVar2;
  int __fd;
  uint uVar3;
  int iVar4;
  int *piVar5;
  addrinfo *paVar6;
  int result;
  int one;
  addrinfo *address_list;
  char portnumber_string [33];
  socklen_t local_ac;
  int local_a8 [2];
  addrinfo *local_a0;
  char local_98 [48];
  addrinfo local_68;
  
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 6;
  iVar4 = 0;
  sprintf(local_98,"%d",portnumber);
  iVar2 = getaddrinfo(hostname,local_98,&local_68,&local_a0);
  __fd = -5;
  if (iVar2 == 0) {
    if (local_a0 == (addrinfo *)0x0) {
      __fd = -1;
      bVar1 = false;
    }
    else {
      paVar6 = local_a0;
      do {
        local_a8[1] = 1;
        __fd = socket(paVar6->ai_family,paVar6->ai_socktype,paVar6->ai_protocol);
        if (__fd == -1) {
          __fd = -9;
        }
        else {
          uVar3 = fcntl(__fd,1);
          iVar2 = -9;
          if (((((uVar3 != 0xffffffff) &&
                (iVar4 = fcntl(__fd,2,(long)(int)(uVar3 | 1)), iVar4 != -1)) &&
               (uVar3 = fcntl(__fd,3), uVar3 != 0xffffffff)) &&
              ((iVar4 = fcntl(__fd,4,(long)(int)(uVar3 | 0x800)), iVar4 != -1 &&
               (iVar4 = setsockopt(__fd,6,1,local_a8 + 1,4), iVar4 == 0)))) &&
             (iVar4 = setsockopt(__fd,1,9,local_a8 + 1,4), iVar4 == 0)) {
            iVar4 = connect(__fd,paVar6->ai_addr,paVar6->ai_addrlen);
            if (iVar4 == 0) goto LAB_00109556;
            piVar5 = __errno_location();
            if ((*piVar5 == 0x73) && (iVar2 = amqp_poll(__fd,4,deadline), iVar2 == 0)) {
              local_ac = 4;
              iVar2 = getsockopt(__fd,1,4,local_a8,&local_ac);
              if (local_a8[0] == 0 && iVar2 != -1) goto LAB_00109556;
              bVar1 = local_a8[0] == 0 && iVar2 != -1;
              iVar2 = (uint)bVar1 + (uint)bVar1 * 8 + -9;
            }
          }
          close(__fd);
          __fd = iVar2;
        }
LAB_00109556:
        if (-1 < __fd) break;
        if (__fd == -0xd) {
          bVar1 = true;
          __fd = -0xd;
          iVar4 = -0xd;
          goto LAB_00109611;
        }
        paVar6 = paVar6->ai_next;
      } while (paVar6 != (addrinfo *)0x0);
      bVar1 = false;
      iVar4 = 0;
    }
LAB_00109611:
    freeaddrinfo(local_a0);
    if (__fd == -1) {
      __fd = iVar4;
    }
    if (bVar1) {
      __fd = iVar4;
    }
  }
  return __fd;
}

Assistant:

int amqp_open_socket_inner(char const *hostname, int portnumber,
                           amqp_time_t deadline) {
  struct addrinfo hint;
  struct addrinfo *address_list;
  struct addrinfo *addr;
  char portnumber_string[33];
  int sockfd = -1;
  int last_error;

  last_error = amqp_os_socket_init();
  if (AMQP_STATUS_OK != last_error) {
    return last_error;
  }

  memset(&hint, 0, sizeof(hint));
  hint.ai_family = PF_UNSPEC; /* PF_INET or PF_INET6 */
  hint.ai_socktype = SOCK_STREAM;
  hint.ai_protocol = IPPROTO_TCP;

  (void)sprintf(portnumber_string, "%d", portnumber);

  last_error = getaddrinfo(hostname, portnumber_string, &hint, &address_list);
  if (0 != last_error) {
    return AMQP_STATUS_HOSTNAME_RESOLUTION_FAILED;
  }

  for (addr = address_list; addr; addr = addr->ai_next) {
    sockfd = connect_socket(addr, deadline);

    if (sockfd >= 0) {
      last_error = AMQP_STATUS_OK;
      break;
    } else if (sockfd == AMQP_STATUS_TIMEOUT) {
      last_error = sockfd;
      break;
    }
  }

  freeaddrinfo(address_list);
  if (last_error != AMQP_STATUS_OK || sockfd == -1) {
    return last_error;
  }
  return sockfd;
}